

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O3

int anon_unknown.dwarf_8b56::CheckHeader(FILE *fp)

{
  undefined1 auVar1 [4];
  undefined8 in_RAX;
  char *__s;
  char data_check [5];
  undefined1 local_18 [4];
  char local_14;
  undefined3 uStack_13;
  
  _local_18 = in_RAX;
  fread(local_18,1,4,(FILE *)fp);
  auVar1 = local_18;
  _local_18 = (uint5)(uint)local_18;
  if (auVar1 == (undefined1  [4])0x46464952) {
    fseek((FILE *)fp,4,1);
    fread(local_18,1,4,(FILE *)fp);
    if (local_14 == '\0' && local_18 == (undefined1  [4])0x45564157) {
      fread(local_18,1,4,(FILE *)fp);
      if (local_14 == '\0' && local_18 == (undefined1  [4])0x20746d66) {
        fread(local_18,1,4,(FILE *)fp);
        if (local_18 == (undefined1  [4])0x10) {
          fread(local_18,1,2,(FILE *)fp);
          __s = "Format ID error.";
          if ((local_18[0] == '\x01') && (local_18[1] == '\0')) {
            fread(local_18,1,2,(FILE *)fp);
            __s = "This function cannot support stereo file";
            if ((local_18[0] == '\x01') && (local_18[1] == '\0')) {
              return 1;
            }
          }
        }
        else {
          __s = "fmt (2) error.";
        }
      }
      else {
        __s = "fmt error.";
      }
    }
    else {
      __s = "WAVE error.";
    }
  }
  else {
    __s = "RIFF error.";
  }
  puts(__s);
  return 0;
}

Assistant:

static int CheckHeader(FILE *fp) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "RIFF"
  data_check[4] = '\0';
  if (0 != strcmp(data_check, "RIFF")) {
    printf("RIFF error.\n");
    return 0;
  }
  fseek(fp, 4, SEEK_CUR);
  fread(data_check, 1, 4, fp);  // "WAVE"
  if (0 != strcmp(data_check, "WAVE")) {
    printf("WAVE error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // "fmt "
  if (0 != strcmp(data_check, "fmt ")) {
    printf("fmt error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // 1 0 0 0
  if (!(16 == data_check[0] && 0 == data_check[1] &&
      0 == data_check[2] && 0 == data_check[3])) {
    printf("fmt (2) error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("Format ID error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("This function cannot support stereo file\n");
    return 0;
  }
  return 1;
}